

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void get_op_access(cs_struct *h,uint id,uint8_t *access,uint64_t *eflags)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t uVar3;
  
  puVar1 = X86_get_op_access(h,id,eflags);
  if (puVar1 != (uint8_t *)0x0) {
    uVar2 = 0;
    do {
      uVar2 = uVar2 & 0xff;
      uVar3 = puVar1[uVar2];
      if (uVar3 == 0x80) {
        uVar3 = '\0';
      }
      else if (uVar3 == '\0') goto LAB_0022bb6e;
      access[uVar2] = uVar3;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while( true );
  }
LAB_0022bb71:
  *access = '\0';
  return;
LAB_0022bb6e:
  access = access + uVar2;
  goto LAB_0022bb71;
}

Assistant:

static void get_op_access(cs_struct *h, unsigned int id, uint8_t *access, uint64_t *eflags)
{
#ifndef CAPSTONE_DIET
	uint8_t i;
	uint8_t *arr = X86_get_op_access(h, id, eflags);

	if (!arr) {
		access[0] = 0;
		return;
	}

	// copy to access but zero out CS_AC_IGNORE
	for(i = 0; arr[i]; i++) {
		if (arr[i] != CS_AC_IGNORE)
			access[i] = arr[i];
		else
			access[i] = 0;
	}

	// mark the end of array
	access[i] = 0;
#endif
}